

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O3

void __thiscall
btSequentialImpulseConstraintSolver::resolveSplitPenetrationImpulseCacheFriendly
          (btSequentialImpulseConstraintSolver *this,btSolverBody *body1,btSolverBody *body2,
          btSolverConstraint *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar1 = c->m_rhsPenetration;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    gNumSplitImpulseRecoveries = gNumSplitImpulseRecoveries + 1;
    fVar2 = c->m_appliedPushImpulse;
    uVar4 = *(undefined8 *)(c->m_contactNormal1).m_floats;
    fVar3 = (c->m_contactNormal1).m_floats[2];
    fVar10 = (float)uVar4;
    fVar11 = (float)((ulong)uVar4 >> 0x20);
    fVar12 = ((fVar1 - c->m_cfm * fVar2) -
             ((body1->m_turnVelocity).m_floats[2] * (c->m_relpos1CrossNormal).m_floats[2] +
              (body1->m_turnVelocity).m_floats[0] * (c->m_relpos1CrossNormal).m_floats[0] +
              (body1->m_turnVelocity).m_floats[1] * (c->m_relpos1CrossNormal).m_floats[1] +
             (body1->m_pushVelocity).m_floats[2] * fVar3 +
             (body1->m_pushVelocity).m_floats[0] * fVar10 +
             (body1->m_pushVelocity).m_floats[1] * fVar11) * c->m_jacDiagABInv) -
             ((body2->m_turnVelocity).m_floats[2] * (c->m_relpos2CrossNormal).m_floats[2] +
              (body2->m_turnVelocity).m_floats[0] * (c->m_relpos2CrossNormal).m_floats[0] +
              (body2->m_turnVelocity).m_floats[1] * (c->m_relpos2CrossNormal).m_floats[1] +
             (body2->m_pushVelocity).m_floats[2] * (c->m_contactNormal2).m_floats[2] +
             (body2->m_pushVelocity).m_floats[0] * (c->m_contactNormal2).m_floats[0] +
             (body2->m_pushVelocity).m_floats[1] * (c->m_contactNormal2).m_floats[1]) *
             c->m_jacDiagABInv;
    fVar1 = c->m_lowerLimit;
    fVar9 = fVar2 + fVar12;
    fVar13 = fVar1;
    if (fVar1 <= fVar9) {
      fVar13 = fVar9;
    }
    fVar1 = (float)(-(uint)(fVar9 < fVar1) & (uint)(fVar1 - fVar2) |
                   ~-(uint)(fVar9 < fVar1) & (uint)fVar12);
    c->m_appliedPushImpulse = fVar13;
    if (body1->m_originalBody != (btRigidBody *)0x0) {
      fVar2 = (body1->m_invMass).m_floats[2];
      fVar13 = (body1->m_linearFactor).m_floats[2];
      uVar4 = *(undefined8 *)(body1->m_angularFactor).m_floats;
      uVar5 = *(undefined8 *)(body1->m_linearFactor).m_floats;
      uVar6 = *(undefined8 *)(body1->m_invMass).m_floats;
      uVar7 = *(undefined8 *)(body1->m_pushVelocity).m_floats;
      *(ulong *)(body1->m_pushVelocity).m_floats =
           CONCAT44(fVar11 * (float)((ulong)uVar6 >> 0x20) * fVar1 * (float)((ulong)uVar5 >> 0x20) +
                    (float)((ulong)uVar7 >> 0x20),
                    fVar10 * (float)uVar6 * fVar1 * (float)uVar5 + (float)uVar7);
      (body1->m_pushVelocity).m_floats[2] =
           fVar3 * fVar2 * fVar1 * fVar13 + (body1->m_pushVelocity).m_floats[2];
      fVar2 = (body1->m_angularFactor).m_floats[2];
      fVar3 = (c->m_angularComponentA).m_floats[2];
      uVar5 = *(undefined8 *)(c->m_angularComponentA).m_floats;
      uVar6 = *(undefined8 *)(body1->m_turnVelocity).m_floats;
      *(ulong *)(body1->m_turnVelocity).m_floats =
           CONCAT44((float)((ulong)uVar6 >> 0x20) +
                    (float)((ulong)uVar5 >> 0x20) * fVar1 * (float)((ulong)uVar4 >> 0x20),
                    (float)uVar6 + (float)uVar5 * fVar1 * (float)uVar4);
      (body1->m_turnVelocity).m_floats[2] =
           fVar2 * fVar1 * fVar3 + (body1->m_turnVelocity).m_floats[2];
    }
    if (body2->m_originalBody != (btRigidBody *)0x0) {
      fVar2 = (c->m_contactNormal2).m_floats[2];
      fVar3 = (body2->m_invMass).m_floats[2];
      fVar13 = (body2->m_linearFactor).m_floats[2];
      uVar4 = *(undefined8 *)(c->m_contactNormal2).m_floats;
      uVar5 = *(undefined8 *)(body2->m_angularFactor).m_floats;
      uVar6 = *(undefined8 *)(body2->m_linearFactor).m_floats;
      uVar7 = *(undefined8 *)(body2->m_invMass).m_floats;
      uVar8 = *(undefined8 *)(body2->m_pushVelocity).m_floats;
      *(ulong *)(body2->m_pushVelocity).m_floats =
           CONCAT44((float)((ulong)uVar7 >> 0x20) * (float)((ulong)uVar4 >> 0x20) * fVar1 *
                    (float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar8 >> 0x20),
                    (float)uVar7 * (float)uVar4 * fVar1 * (float)uVar6 + (float)uVar8);
      (body2->m_pushVelocity).m_floats[2] =
           fVar1 * fVar2 * fVar3 * fVar13 + (body2->m_pushVelocity).m_floats[2];
      fVar2 = (body2->m_angularFactor).m_floats[2];
      fVar3 = (c->m_angularComponentB).m_floats[2];
      uVar4 = *(undefined8 *)(c->m_angularComponentB).m_floats;
      uVar6 = *(undefined8 *)(body2->m_turnVelocity).m_floats;
      *(ulong *)(body2->m_turnVelocity).m_floats =
           CONCAT44((float)((ulong)uVar6 >> 0x20) +
                    (float)((ulong)uVar4 >> 0x20) * fVar1 * (float)((ulong)uVar5 >> 0x20),
                    (float)uVar6 + (float)uVar4 * fVar1 * (float)uVar5);
      (body2->m_turnVelocity).m_floats[2] =
           fVar2 * fVar1 * fVar3 + (body2->m_turnVelocity).m_floats[2];
    }
  }
  return;
}

Assistant:

void	btSequentialImpulseConstraintSolver::resolveSplitPenetrationImpulseCacheFriendly(
        btSolverBody& body1,
        btSolverBody& body2,
        const btSolverConstraint& c)
{
		if (c.m_rhsPenetration)
        {
			gNumSplitImpulseRecoveries++;
			btScalar deltaImpulse = c.m_rhsPenetration-btScalar(c.m_appliedPushImpulse)*c.m_cfm;
			const btScalar deltaVel1Dotn	=	c.m_contactNormal1.dot(body1.internalGetPushVelocity()) 	+ c.m_relpos1CrossNormal.dot(body1.internalGetTurnVelocity());
			const btScalar deltaVel2Dotn	=	c.m_contactNormal2.dot(body2.internalGetPushVelocity())		+ c.m_relpos2CrossNormal.dot(body2.internalGetTurnVelocity());

			deltaImpulse	-=	deltaVel1Dotn*c.m_jacDiagABInv;
			deltaImpulse	-=	deltaVel2Dotn*c.m_jacDiagABInv;
			const btScalar sum = btScalar(c.m_appliedPushImpulse) + deltaImpulse;
			if (sum < c.m_lowerLimit)
			{
				deltaImpulse = c.m_lowerLimit-c.m_appliedPushImpulse;
				c.m_appliedPushImpulse = c.m_lowerLimit;
			}
			else
			{
				c.m_appliedPushImpulse = sum;
			}
			body1.internalApplyPushImpulse(c.m_contactNormal1*body1.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
			body2.internalApplyPushImpulse(c.m_contactNormal2*body2.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
        }
}